

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

xmlRelaxNGValidCtxtPtr xmlRelaxNGNewValidCtxt(xmlRelaxNGPtr schema)

{
  xmlRelaxNGValidCtxtPtr ret;
  xmlRelaxNGPtr schema_local;
  
  schema_local = (xmlRelaxNGPtr)(*xmlMalloc)(0xc0);
  if (schema_local == (xmlRelaxNGPtr)0x0) {
    xmlRngVErrMemory((xmlRelaxNGValidCtxtPtr)0x0);
    schema_local = (xmlRelaxNGPtr)0x0;
  }
  else {
    memset(schema_local,0,0xc0);
    schema_local->refs = (xmlHashTablePtr)schema;
    *(undefined4 *)&schema_local[1]._private = 0;
    *(undefined4 *)((long)&schema_local[1]._private + 4) = 0;
    schema_local->defTab = (xmlRelaxNGDefinePtr_conflict *)0x0;
    schema_local[1].topgrammar = (xmlRelaxNGGrammarPtr_conflict)0x0;
    if (schema != (xmlRelaxNGPtr)0x0) {
      schema_local->defNr = schema->idref;
    }
    *(undefined8 *)&schema_local[1].idref = 0;
    schema_local[1].defs = (xmlHashTablePtr)0x0;
    schema_local[1].documents = (xmlRelaxNGDocumentPtr_conflict)0x0;
    *(undefined4 *)&schema_local->field_0x44 = 0;
  }
  return (xmlRelaxNGValidCtxtPtr)schema_local;
}

Assistant:

xmlRelaxNGValidCtxtPtr
xmlRelaxNGNewValidCtxt(xmlRelaxNGPtr schema)
{
    xmlRelaxNGValidCtxtPtr ret;

    ret = (xmlRelaxNGValidCtxtPtr) xmlMalloc(sizeof(xmlRelaxNGValidCtxt));
    if (ret == NULL) {
        xmlRngVErrMemory(NULL);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlRelaxNGValidCtxt));
    ret->schema = schema;
    ret->errNr = 0;
    ret->errMax = 0;
    ret->err = NULL;
    ret->errTab = NULL;
    if (schema != NULL)
	ret->idref = schema->idref;
    ret->states = NULL;
    ret->freeState = NULL;
    ret->freeStates = NULL;
    ret->errNo = XML_RELAXNG_OK;
    return (ret);
}